

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_materialized_collector.cpp
# Opt level: O3

unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true> __thiscall
duckdb::PhysicalMaterializedCollector::GetGlobalSinkState
          (PhysicalMaterializedCollector *this,ClientContext *context)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  pointer pMVar3;
  _Head_base<0UL,_duckdb::MaterializedCollectorGlobalState_*,_false> local_30;
  enable_shared_from_this<duckdb::ClientContext> local_28;
  
  local_30._M_head_impl = (MaterializedCollectorGlobalState *)operator_new(0x98);
  ((local_30._M_head_impl)->super_GlobalSinkState)._vptr_GlobalSinkState = (_func_int **)0x0;
  *(undefined8 *)&((local_30._M_head_impl)->super_GlobalSinkState).super_StateWithBlockableTasks = 0
  ;
  *(undefined8 *)&((local_30._M_head_impl)->super_GlobalSinkState).state = 0;
  ((local_30._M_head_impl)->glock).super___mutex_base._M_mutex.__align = 0;
  ((local_30._M_head_impl)->super_GlobalSinkState).super_StateWithBlockableTasks.lock.
  super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&((local_30._M_head_impl)->super_GlobalSinkState).super_StateWithBlockableTasks.lock.
           super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&((local_30._M_head_impl)->super_GlobalSinkState).super_StateWithBlockableTasks.lock.
           super___mutex_base._M_mutex + 0x10) = 0;
  ((local_30._M_head_impl)->super_GlobalSinkState).super_StateWithBlockableTasks.lock.
  super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  *(__pthread_internal_list **)
   ((long)&((local_30._M_head_impl)->super_GlobalSinkState).super_StateWithBlockableTasks.lock.
           super___mutex_base._M_mutex.__data.__list + 8) = (__pthread_internal_list *)0x0;
  ((local_30._M_head_impl)->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&((local_30._M_head_impl)->super_GlobalSinkState).super_StateWithBlockableTasks.
           blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&((local_30._M_head_impl)->super_GlobalSinkState).super_StateWithBlockableTasks.
           blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl + 0x10) = (pointer)0x0;
  ((local_30._M_head_impl)->super_GlobalSinkState).super_StateWithBlockableTasks.can_block._M_base.
  _M_i = true;
  ((local_30._M_head_impl)->super_GlobalSinkState).state = READY;
  ((local_30._M_head_impl)->super_GlobalSinkState)._vptr_GlobalSinkState =
       (_func_int **)&PTR__MaterializedCollectorGlobalState_02461110;
  *(undefined8 *)((long)&((local_30._M_head_impl)->glock).super___mutex_base._M_mutex + 0x10) = 0;
  ((local_30._M_head_impl)->glock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  ((local_30._M_head_impl)->glock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  ((local_30._M_head_impl)->collection).
  super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
  .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> =
       (_Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>)0x0;
  ((local_30._M_head_impl)->context).internal.
  super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  ((local_30._M_head_impl)->context).internal.
  super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ((local_30._M_head_impl)->glock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&((local_30._M_head_impl)->glock).super___mutex_base._M_mutex + 8) = 0;
  enable_shared_from_this<duckdb::ClientContext>::shared_from_this(&local_28);
  pMVar3 = unique_ptr<duckdb::MaterializedCollectorGlobalState,_std::default_delete<duckdb::MaterializedCollectorGlobalState>,_true>
           ::operator->((unique_ptr<duckdb::MaterializedCollectorGlobalState,_std::default_delete<duckdb::MaterializedCollectorGlobalState>,_true>
                         *)&local_30);
  _Var2._M_pi = local_28.__weak_this_.internal.
                super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  peVar1 = local_28.__weak_this_.internal.
           super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_28.__weak_this_.internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_28.__weak_this_.internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (pMVar3->context).internal.
            super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pMVar3->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar1;
  (pMVar3->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (local_28.__weak_this_.internal.
        super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_28.__weak_this_.internal.
                 super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  (this->super_PhysicalResultCollector).super_PhysicalOperator._vptr_PhysicalOperator =
       (_func_int **)local_30._M_head_impl;
  return (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)
         (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)this;
}

Assistant:

unique_ptr<GlobalSinkState> PhysicalMaterializedCollector::GetGlobalSinkState(ClientContext &context) const {
	auto state = make_uniq<MaterializedCollectorGlobalState>();
	state->context = context.shared_from_this();
	return std::move(state);
}